

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

string * __thiscall CInv::ToString_abi_cxx11_(CInv *this)

{
  long lVar1;
  char *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  out_of_range *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  base_blob<256U> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  CInv *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetCommand_abi_cxx11_(in_stack_ffffffffffffffb0);
  base_blob<256u>::ToString_abi_cxx11_(in_stack_ffffffffffffff50);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (in_RSI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string CInv::ToString() const
{
    try {
        return strprintf("%s %s", GetCommand(), hash.ToString());
    } catch(const std::out_of_range &) {
        return strprintf("0x%08x %s", type, hash.ToString());
    }
}